

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

int __thiscall cmCursesMainForm::Generate(cmCursesMainForm *this)

{
  bool bVar1;
  pointer pcVar2;
  cmCursesLongMessageForm *this_00;
  uint local_110;
  uint local_10c;
  uint local_100;
  uint local_fc;
  int yi;
  int xi;
  cmCursesLongMessageForm *msgs;
  char *title;
  int yy;
  int xx;
  int local_7c;
  anon_class_8_1_8991fb9c aStack_78;
  int retVal;
  ProgressCallbackType local_70;
  allocator<char> local_39;
  string local_38;
  cmCursesMainForm *local_18;
  cmCursesMainForm *this_local;
  
  local_18 = this;
  ResetOutputs(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Generating",&local_39);
  UpdateProgress(this,&local_38,0.0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar2 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
  aStack_78.this = this;
  std::function<void(std::__cxx11::string_const&,float)>::
  function<cmCursesMainForm::Generate()::__0,void>
            ((function<void(std::__cxx11::string_const&,float)> *)&local_70,&stack0xffffffffffffff88
            );
  cmake::SetProgressCallback(pcVar2,&local_70);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function(&local_70);
  pcVar2 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
  local_7c = cmake::Generate(pcVar2);
  pcVar2 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
              *)&yy,(nullptr_t)0x0);
  cmake::SetProgressCallback
            (pcVar2,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
                     *)&yy);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
               *)&yy);
  keypad(_stdscr,1);
  if ((local_7c != 0) || ((this->HasNonStatusOutputs & 1U) != 0)) {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      this->OkToGenerate = false;
    }
    cmSystemTools::ResetErrorOccurredFlag();
    if (_stdscr == 0) {
      local_fc = 0xffffffff;
      local_100 = 0xffffffff;
    }
    else {
      local_fc = (int)*(short *)(_stdscr + 4) + 1;
      local_100 = (int)*(short *)(_stdscr + 6) + 1;
    }
    msgs = (cmCursesLongMessageForm *)anon_var_dwarf_34635;
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      msgs = (cmCursesLongMessageForm *)anon_var_dwarf_3464f;
    }
    this_00 = (cmCursesLongMessageForm *)operator_new(0x68);
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_00,&this->Outputs,(char *)msgs,ScrollDown)
    ;
    cmCursesForm::CurrentForm = (cmCursesForm *)this_00;
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[3])
              (this_00,1,1,(ulong)local_100,(ulong)local_fc);
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[2])();
    if (local_7c == -2) {
      return -2;
    }
  }
  InitializeUI(this);
  if (_stdscr == 0) {
    local_10c = 0xffffffff;
    local_110 = 0xffffffff;
  }
  else {
    local_10c = (int)*(short *)(_stdscr + 4) + 1;
    local_110 = (int)*(short *)(_stdscr + 6) + 1;
  }
  cmCursesForm::CurrentForm = &this->super_cmCursesForm;
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)local_110,(ulong)local_10c);
  return 0;
}

Assistant:

int cmCursesMainForm::Generate()
{
  this->ResetOutputs();

  this->UpdateProgress("Generating", 0);
  this->CMakeInstance->SetProgressCallback(
    [this](const std::string& msg, float prog) {
      this->UpdateProgress(msg, prog);
    });

  // run the generate process
  int retVal = this->CMakeInstance->Generate();

  this->CMakeInstance->SetProgressCallback(nullptr);
  keypad(stdscr, true); /* Use key symbols as KEY_DOWN */

  if (retVal != 0 || this->HasNonStatusOutputs) {
    // see if there was an error
    if (cmSystemTools::GetErrorOccurredFlag()) {
      this->OkToGenerate = false;
    }
    // reset error condition
    cmSystemTools::ResetErrorOccurredFlag();
    int xx;
    int yy;
    getmaxyx(stdscr, yy, xx);
    const char* title = "Generate produced the following output";
    if (cmSystemTools::GetErrorOccurredFlag()) {
      title = "Generate failed with the following output";
    }
    cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
      this->Outputs, title,
      cmCursesLongMessageForm::ScrollBehavior::ScrollDown);
    CurrentForm = msgs;
    msgs->Render(1, 1, xx, yy);
    msgs->HandleInput();
    // If they typed the wrong source directory, we report
    // an error and exit
    if (retVal == -2) {
      return retVal;
    }
  }

  this->InitializeUI();
  CurrentForm = this;
  int xi;
  int yi;
  getmaxyx(stdscr, yi, xi);
  this->Render(1, 1, xi, yi);

  return 0;
}